

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall
absl::lts_20240722::Cord::AppendImpl<absl::lts_20240722::Cord_const&>(Cord *this,Cord *src)

{
  byte bVar1;
  Nonnull<CordRep_*> pCVar2;
  CordRep *pCVar3;
  ulong uVar4;
  long *plVar5;
  size_t sVar6;
  undefined8 uVar7;
  byte bVar8;
  ulong uVar9;
  uint8_t *puVar10;
  CordRep *pCVar11;
  bool bVar12;
  string_view src_00;
  string_view src_01;
  ChunkIterator __begin0;
  anon_union_16_2_39e9c77e_for_Rep_0 local_b8;
  undefined8 local_a8;
  size_t sStack_a0;
  CordRepBtreeReader local_98;
  
  bVar8 = (this->contents_).data_.rep_.field_0.data[0];
  pCVar11 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar11 != (CordRep *)0x0 && (bVar8 & 1) != 0) && (pCVar11->length == 0)) goto LAB_0010ff61;
  do {
    bVar1 = (byte)((CordRepBtreeReader *)src)->remaining_;
    uVar4 = (ulong)(char)bVar1;
    if ((uVar4 & 1) == 0) {
      uVar9 = uVar4 >> 1;
    }
    else {
      uVar9 = **(ulong **)&((CordRepBtreeReader *)src)->navigator_;
    }
    if (uVar9 == 0) {
      return;
    }
    if ((bVar8 & 1) == 0) {
      uVar9 = (ulong)(long)(char)bVar8 >> 1;
    }
    else {
      uVar9 = pCVar11->length;
    }
    if (uVar9 == 0) {
      if ((bVar1 & 1) == 0) {
        pCVar11 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info =
             ((CordRepBtreeReader *)src)->remaining_;
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar11;
      }
      else {
        pCVar11 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
        if (pCVar11 == (CordRep *)0x0) goto LAB_00110052;
        LOCK();
        (pCVar11->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar11->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        if (pCVar11->tag == '\x02') {
          pCVar3 = (CordRep *)pCVar11[1].length;
          if ((pCVar11->refcount).count_.super___atomic_base<int>._M_i == 2) {
            if (pCVar11->tag != '\x02') goto LAB_001100af;
            absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState
                      ((CrcCordState *)&pCVar11[1].refcount);
            operator_delete(pCVar11,0x20);
            pCVar11 = pCVar3;
            if (pCVar3 == (CordRep *)0x0) {
              __assert_fail("rep",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                            ,0x4f2,
                            "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                           );
            }
          }
          else {
            if (pCVar3 == (CordRep *)0x0) goto LAB_00110052;
            LOCK();
            (pCVar3->refcount).count_.super___atomic_base<int>._M_i =
                 (pCVar3->refcount).count_.super___atomic_base<int>._M_i + 2;
            UNLOCK();
            cord_internal::CordRep::Unref(pCVar11);
            pCVar11 = pCVar3;
          }
        }
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar11;
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
        plVar5 = (long *)__tls_get_addr(&PTR_0011cfd0);
        if (*plVar5 < 2) {
          AppendImpl<absl::lts_20240722::Cord_const&>();
        }
        else {
          *plVar5 = *plVar5 + -1;
        }
      }
      return;
    }
    if ((uVar4 & 1) == 0) {
      uVar4 = uVar4 >> 1;
    }
    else {
      uVar4 = **(ulong **)&((CordRepBtreeReader *)src)->navigator_;
    }
    bVar12 = (bVar1 & 1) == 0;
    pCVar11 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
    if (0x1ff < uVar4) {
      if (pCVar11 == (CordRep *)0x0 || bVar12) {
LAB_00110052:
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x370,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
      }
      LOCK();
      (pCVar11->refcount).count_.super___atomic_base<int>._M_i =
           (pCVar11->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
      if (pCVar11->tag == '\x02') {
        pCVar2 = (Nonnull<CordRep_*>)pCVar11[1].length;
        if ((pCVar11->refcount).count_.super___atomic_base<int>._M_i == 2) {
          if (pCVar11->tag != '\x02') {
LAB_001100af:
            __assert_fail("IsCrc()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                          ,0x5a,"CordRepCrc *absl::cord_internal::CordRep::crc()");
          }
          AppendImpl<absl::lts_20240722::Cord_const&>((Cord *)pCVar11);
          pCVar11 = pCVar2;
        }
        else {
          if (pCVar2 == (Nonnull<CordRep_*>)0x0) goto LAB_00110052;
          LOCK();
          (pCVar2->refcount).count_.super___atomic_base<int>._M_i =
               (pCVar2->refcount).count_.super___atomic_base<int>._M_i + 2;
          UNLOCK();
          cord_internal::CordRep::Unref(pCVar11);
          pCVar11 = pCVar2;
        }
      }
      InlineRep::AppendTree(&this->contents_,pCVar11,kAppendCord);
      return;
    }
    if (pCVar11 == (CordRep *)0x0 || bVar12) {
      puVar10 = (uint8_t *)0x0;
      if ((bVar1 & 1) == 0) {
        puVar10 = (uint8_t *)((long)&((CordRepBtreeReader *)src)->remaining_ + 1);
      }
LAB_0010fe48:
      src_00._M_str = (char *)puVar10;
      src_00._M_len = uVar4;
      InlineRep::AppendArray(&this->contents_,src_00,kAppendCord);
      return;
    }
    if (5 < pCVar11->tag) {
      if (0xf8 < pCVar11->tag) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
      }
      puVar10 = pCVar11->storage;
      goto LAB_0010fe48;
    }
    if (src == this) {
      Cord((Cord *)&local_b8.as_tree,src);
      AppendImpl<absl::lts_20240722::Cord>(this,(Cord *)&local_b8.as_tree);
      ~Cord((Cord *)&local_b8.as_tree);
      return;
    }
    local_a8 = 0;
    local_b8 = (anon_union_16_2_39e9c77e_for_Rep_0)ZEXT816(0);
    local_98.remaining_ = 0;
    local_98.navigator_.height_ = -1;
    sStack_a0 = pCVar11->length;
    if (sStack_a0 == 0) {
      return;
    }
    ChunkIterator::InitTree((ChunkIterator *)&local_b8.as_tree,pCVar11);
    if (sStack_a0 == 0) {
      return;
    }
    src = (Cord *)&local_98;
    uVar7 = local_b8.as_tree.cordz_info;
    while( true ) {
      src_01._M_str = (char *)local_b8.as_tree.rep;
      src_01._M_len = uVar7;
      InlineRep::AppendArray(&this->contents_,src_01,kAppendString);
      if (sStack_a0 == 0) break;
      sVar6 = sStack_a0 - local_b8._0_8_;
      if (sStack_a0 < (ulong)local_b8.as_tree.cordz_info) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                      ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      uVar7 = sStack_a0;
      sStack_a0 = sVar6;
      if (sVar6 != 0) {
        if (((long)local_98.navigator_.height_ < 0) ||
           (local_98.navigator_.node_[local_98.navigator_.height_] == (CordRepBtree *)0x0)) {
          if (local_b8.as_tree.cordz_info == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                          ,0x621,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_b8 = (anon_union_16_2_39e9c77e_for_Rep_0)ZEXT816(0);
          uVar7 = 0;
        }
        else {
          local_b8.as_tree =
               (AsTree)cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)src);
          uVar7 = local_b8.as_tree.cordz_info;
        }
      }
      if (sStack_a0 == 0) {
        return;
      }
    }
    AppendImpl<absl::lts_20240722::Cord_const&>();
LAB_0010ff61:
    AppendImpl<absl::lts_20240722::Cord_const&>();
    pCVar11 = (CordRep *)0x0;
    bVar8 = 0;
  } while( true );
}

Assistant:

inline void Cord::AppendImpl(C&& src) {
  auto constexpr method = CordzUpdateTracker::kAppendCord;

  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;

  if (empty()) {
    // Since destination is empty, we can avoid allocating a node,
    if (src.contents_.is_tree()) {
      // by taking the tree directly
      CordRep* rep =
          cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
      contents_.EmplaceTree(rep, method);
    } else {
      // or copying over inline data
      contents_.data_ = src.contents_.data_;
    }
    return;
  }

  // For short cords, it is faster to copy data if there is room in dst.
  const size_t src_size = src.contents_.size();
  if (src_size <= kMaxBytesToCopy) {
    CordRep* src_tree = src.contents_.tree();
    if (src_tree == nullptr) {
      // src has embedded data.
      contents_.AppendArray({src.contents_.data(), src_size}, method);
      return;
    }
    if (src_tree->IsFlat()) {
      // src tree just has one flat node.
      contents_.AppendArray({src_tree->flat()->Data(), src_size}, method);
      return;
    }
    if (&src == this) {
      // ChunkIterator below assumes that src is not modified during traversal.
      Append(Cord(src));
      return;
    }
    // TODO(mec): Should we only do this if "dst" has space?
    for (absl::string_view chunk : src.Chunks()) {
      Append(chunk);
    }
    return;
  }

  // Guaranteed to be a tree (kMaxBytesToCopy > kInlinedSize)
  CordRep* rep = cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
  contents_.AppendTree(rep, CordzUpdateTracker::kAppendCord);
}